

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O2

void TestPageMap(void)

{
  void ****__s;
  void **ppvVar1;
  void ***pppvVar2;
  uint __line;
  bool bVar3;
  PageMap *this;
  char *__assertion;
  
  puts("===================== TestPageMap BEGIN =====================");
  this = (PageMap *)operator_new(0x2000040);
  (this->internal_allocator).inited = false;
  (this->internal_allocator).construct = true;
  (this->leaf_allocator).inited = false;
  (this->leaf_allocator).construct = true;
  __s = this->roots;
  memset(__s,0,0x2000000);
  bVar3 = tcmalloc::PageMap::Set(this,1,(void *)0x2);
  if (bVar3) {
    bVar3 = tcmalloc::PageMap::Set(this,2,(void *)0x2);
    if (bVar3) {
      bVar3 = tcmalloc::PageMap::Set(this,2,(void *)0x3);
      if (bVar3) {
        if (((*__s == (void ***)0x0) || (ppvVar1 = **__s, ppvVar1 == (void **)0x0)) ||
           (ppvVar1[1] != (void *)0x2)) {
          __assertion = "pm->Get(0x1) == (void*)2";
          __line = 0x73;
        }
        else if (ppvVar1[3] == (void *)0x0) {
          bVar3 = tcmalloc::PageMap::Set(this,0xf00fff0,(void *)0x2);
          if (bVar3) {
            bVar3 = tcmalloc::PageMap::Set(this,0xf00fff1,(void *)0x2);
            if (bVar3) {
              bVar3 = tcmalloc::PageMap::Set(this,0xff00fff0,(void *)0x3);
              if (bVar3) {
                pppvVar2 = *__s;
                if (((pppvVar2 == (void ***)0x0) || (pppvVar2[0xf0] == (void **)0x0)) ||
                   (pppvVar2[0xf0][0xfff1] != (void *)0x2)) {
                  __assertion = "pm->Get(0x0f00fff1) == (void*)2";
                  __line = 0x79;
                }
                else if ((pppvVar2[0xff0] == (void **)0x0) ||
                        (pppvVar2[0xff0][0xfff0] != (void *)0x3)) {
                  __assertion = "pm->Get(0xff00fff0) == (void*)3";
                  __line = 0x7a;
                }
                else if ((pppvVar2[0x8f0] == (void **)0x0) ||
                        (pppvVar2[0x8f0][0xfff0] == (void *)0x0)) {
                  bVar3 = tcmalloc::PageMap::Set(this,0xfff100000f00fff0,(void *)0x2);
                  if (bVar3) {
                    bVar3 = tcmalloc::PageMap::Set(this,0xfff200000f00fff1,(void *)0x2);
                    if (bVar3) {
                      bVar3 = tcmalloc::PageMap::Set(this,0xfff30000ff00fff0,(void *)0x3);
                      if (bVar3) {
                        if (((this->roots[0x3ffc80] == (void ***)0x0) ||
                            (ppvVar1 = this->roots[0x3ffc80][0xf0], ppvVar1 == (void **)0x0)) ||
                           (ppvVar1[0xfff1] != (void *)0x2)) {
                          __assert_fail("pm->Get(0xfff200000f00fff1) == (void*)2",
                                        "/workspace/llm4binary/github/license_all_cmakelists_25/jamsonzan[P]tcmalloc/example/test/main.cpp"
                                        ,0x80,"void TestPageMap()");
                        }
                        if (((this->roots[0x3ffcc0] != (void ***)0x0) &&
                            (ppvVar1 = this->roots[0x3ffcc0][0xff0], ppvVar1 != (void **)0x0)) &&
                           (ppvVar1[0xfff0] == (void *)0x3)) {
                          if (((this->roots[0x3fffc0] != (void ***)0x0) &&
                              (ppvVar1 = this->roots[0x3fffc0][0x8f0], ppvVar1 != (void **)0x0)) &&
                             (ppvVar1[0xfff0] != (void *)0x0)) {
                            __assert_fail("pm->Get(0xffff00008f00fff0) == nullptr",
                                          "/workspace/llm4binary/github/license_all_cmakelists_25/jamsonzan[P]tcmalloc/example/test/main.cpp"
                                          ,0x82,"void TestPageMap()");
                          }
                          operator_delete(this,0x2000040);
                          puts("===================== TestPageMap PASS =====================");
                          return;
                        }
                        __assert_fail("pm->Get(0xfff30000ff00fff0) == (void*)3",
                                      "/workspace/llm4binary/github/license_all_cmakelists_25/jamsonzan[P]tcmalloc/example/test/main.cpp"
                                      ,0x81,"void TestPageMap()");
                      }
                      __assertion = "pm->Set(0xfff30000ff00fff0, (void*)3)";
                      __line = 0x7f;
                    }
                    else {
                      __assertion = "pm->Set(0xfff200000f00fff1, (void*)2)";
                      __line = 0x7e;
                    }
                  }
                  else {
                    __assertion = "pm->Set(0xfff100000f00fff0, (void*)2)";
                    __line = 0x7d;
                  }
                }
                else {
                  __assertion = "pm->Get(0x8f00fff0) == nullptr";
                  __line = 0x7b;
                }
              }
              else {
                __assertion = "pm->Set(0xff00fff0, (void*)3)";
                __line = 0x78;
              }
            }
            else {
              __assertion = "pm->Set(0x0f00fff1, (void*)2)";
              __line = 0x77;
            }
          }
          else {
            __assertion = "pm->Set(0x0f00fff0, (void*)2)";
            __line = 0x76;
          }
        }
        else {
          __assertion = "pm->Get(0x3) == nullptr";
          __line = 0x74;
        }
      }
      else {
        __assertion = "pm->Set(0x2, (void*)3)";
        __line = 0x72;
      }
    }
    else {
      __assertion = "pm->Set(0x2, (void*)2)";
      __line = 0x71;
    }
  }
  else {
    __assertion = "pm->Set(0x1, (void*)2)";
    __line = 0x70;
  }
  __assert_fail(__assertion,
                "/workspace/llm4binary/github/license_all_cmakelists_25/jamsonzan[P]tcmalloc/example/test/main.cpp"
                ,__line,"void TestPageMap()");
}

Assistant:

void TestPageMap() {
    printf("===================== TestPageMap BEGIN =====================\n");
    auto* pm = new tcmalloc::PageMap();
    assert(pm->Set(0x1, (void*)2));
    assert(pm->Set(0x2, (void*)2));
    assert(pm->Set(0x2, (void*)3));
    assert(pm->Get(0x1) == (void*)2);
    assert(pm->Get(0x3) == nullptr);

    assert(pm->Set(0x0f00fff0, (void*)2));
    assert(pm->Set(0x0f00fff1, (void*)2));
    assert(pm->Set(0xff00fff0, (void*)3));
    assert(pm->Get(0x0f00fff1) == (void*)2);
    assert(pm->Get(0xff00fff0) == (void*)3);
    assert(pm->Get(0x8f00fff0) == nullptr);

    assert(pm->Set(0xfff100000f00fff0, (void*)2));
    assert(pm->Set(0xfff200000f00fff1, (void*)2));
    assert(pm->Set(0xfff30000ff00fff0, (void*)3));
    assert(pm->Get(0xfff200000f00fff1) == (void*)2);
    assert(pm->Get(0xfff30000ff00fff0) == (void*)3);
    assert(pm->Get(0xffff00008f00fff0) == nullptr);
    delete pm;
    printf("===================== TestPageMap PASS =====================\n");
}